

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

int * Gia_ManDeriveNexts(Gia_Man_t *p)

{
  int iVar1;
  Gia_Rpr_t *pGVar2;
  undefined1 auVar3 [16];
  int *piVar4;
  void *__ptr;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  size_t __nmemb;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  long lVar10;
  
  pGVar2 = p->pReprs;
  if (pGVar2 == (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pReprs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                  ,0x108,"int *Gia_ManDeriveNexts(Gia_Man_t *)");
  }
  if (p->pNexts != (int *)0x0) {
    __assert_fail("p->pNexts == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                  ,0x109,"int *Gia_ManDeriveNexts(Gia_Man_t *)");
  }
  iVar1 = p->nObjs;
  __nmemb = (size_t)iVar1;
  piVar4 = (int *)calloc(__nmemb,4);
  __ptr = malloc(__nmemb * 4);
  auVar3 = _DAT_0094e250;
  if (0 < (long)__nmemb) {
    lVar10 = __nmemb - 1;
    auVar8._8_4_ = (int)lVar10;
    auVar8._0_8_ = lVar10;
    auVar8._12_4_ = (int)((ulong)lVar10 >> 0x20);
    uVar7 = 0;
    auVar8 = auVar8 ^ _DAT_0094e250;
    auVar9 = _DAT_0094e240;
    do {
      auVar11 = auVar9 ^ auVar3;
      if ((bool)(~(auVar11._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar11._0_4_ ||
                  auVar8._4_4_ < auVar11._4_4_) & 1)) {
        *(int *)((long)__ptr + uVar7 * 4) = (int)uVar7;
      }
      if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
          auVar11._12_4_ <= auVar8._12_4_) {
        *(int *)((long)__ptr + uVar7 * 4 + 4) = (int)uVar7 + 1;
      }
      uVar7 = uVar7 + 2;
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
    } while ((iVar1 + 1U & 0xfffffffe) != uVar7);
    if (iVar1 < 1) goto LAB_001fd192;
    sVar5 = 0;
    do {
      uVar6 = (uint)pGVar2[sVar5] & 0xfffffff;
      if ((uVar6 != 0) && (uVar6 != 0xfffffff)) {
        piVar4[*(uint *)((long)__ptr + (ulong)uVar6 * 4)] = (int)sVar5;
        *(int *)((long)__ptr + (ulong)uVar6 * 4) = (int)sVar5;
      }
      sVar5 = sVar5 + 1;
    } while (__nmemb != sVar5);
  }
  if (__ptr == (void *)0x0) {
    return piVar4;
  }
LAB_001fd192:
  free(__ptr);
  return piVar4;
}

Assistant:

int * Gia_ManDeriveNexts( Gia_Man_t * p )
{
    unsigned * pNexts, * pTails;
    int i;
    assert( p->pReprs != NULL );
    assert( p->pNexts == NULL );
    pNexts = ABC_CALLOC( unsigned, Gia_ManObjNum(p) );
    pTails = ABC_ALLOC( unsigned, Gia_ManObjNum(p) );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        pTails[i] = i;
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
    {
        if ( !p->pReprs[i].iRepr || p->pReprs[i].iRepr == GIA_VOID )
            continue;
        pNexts[ pTails[p->pReprs[i].iRepr] ] = i;
        pTails[p->pReprs[i].iRepr] = i;
    }
    ABC_FREE( pTails );
    return (int *)pNexts;
}